

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreePrevious(BtCursor *pCur,int flags)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  MemPage *pMVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)flags;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (((pCur->eState == '\0') && (pCur->ix != 0)) && (pCur->pPage->leaf != '\0')) {
    pCur->ix = pCur->ix - 1;
    return 0;
  }
  bVar3 = pCur->eState;
  if (bVar3 != 0) {
    if (2 < bVar3) {
      iVar4 = btreeRestoreCursorPosition(pCur);
      if (iVar4 != 0) {
        return iVar4;
      }
      bVar3 = pCur->eState;
    }
    if (bVar3 == 1) {
      return 0x65;
    }
    if ((bVar3 == 2) && (pCur->eState = '\0', pCur->skipNext < 0)) {
      return 0;
    }
  }
  iVar4 = (int)uVar7;
  pMVar6 = pCur->pPage;
  uVar1 = pCur->ix;
  if (pMVar6->leaf == '\0') {
    uVar2 = *(uint *)(pMVar6->aData +
                     (CONCAT11(pMVar6->aCellIdx[(ulong)uVar1 * 2],
                               pMVar6->aCellIdx[(ulong)uVar1 * 2 + 1]) & pMVar6->maskPage));
    iVar5 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
    if (iVar5 == 0) {
      iVar4 = moveToRightmost(pCur);
      return iVar4;
    }
  }
  else {
    if (uVar1 == 0) {
      do {
        if (pCur->iPage == '\0') {
          pCur->eState = '\x01';
          return 0x65;
        }
        moveToParent(pCur);
        iVar4 = (int)uVar7;
        uVar1 = pCur->ix;
      } while (uVar1 == 0);
      pMVar6 = pCur->pPage;
    }
    pCur->ix = uVar1 - 1;
    iVar5 = 0;
    if ((pMVar6->intKey != '\0') && (pMVar6->leaf == '\0')) {
      iVar4 = sqlite3BtreePrevious(pCur,iVar4);
      return iVar4;
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int flags){
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->ix==0
   || pCur->pPage->leaf==0
  ){
    return btreePrevious(pCur);
  }
  pCur->ix--;
  return SQLITE_OK;
}